

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O0

int32 gauden_mllr_transform(gauden_t *g,ps_mllr_t *mllr,ps_config_t *config)

{
  long lVar1;
  logmath_t *lmath;
  ps_mllr_t *g_00;
  char *pcVar2;
  float ****ppppfVar3;
  void *ptr;
  double dVar4;
  int local_44;
  int l;
  float64 *temp;
  int32 *flen;
  int32 d;
  int32 f;
  int32 m;
  int32 i;
  ps_config_t *config_local;
  ps_mllr_t *mllr_local;
  gauden_t *g_local;
  
  _m = config;
  config_local = (ps_config_t *)mllr;
  mllr_local = (ps_mllr_t *)g;
  if (g->mean != (mfcc_t ****)0x0) {
    gauden_param_free(g->mean);
  }
  if (*(long *)&mllr_local->n_feat != 0) {
    gauden_param_free(*(mfcc_t *****)&mllr_local->n_feat);
  }
  if (mllr_local->veclen != (int *)0x0) {
    ckd_free_3d(mllr_local->veclen);
  }
  if (mllr_local->cb2mllr != (int32 *)0x0) {
    ckd_free(mllr_local->cb2mllr);
  }
  mllr_local->veclen = (int *)0x0;
  mllr_local->cb2mllr = (int32 *)0x0;
  pcVar2 = ps_config_str(_m,"mean");
  ppppfVar3 = gauden_param_read(pcVar2,(int32 *)&mllr_local->b,(int32 *)((long)&mllr_local->b + 4),
                                (int32 *)&mllr_local->h,&mllr_local->cb2mllr);
  *(float *****)mllr_local = ppppfVar3;
  pcVar2 = ps_config_str(_m,"var");
  ppppfVar3 = gauden_param_read(pcVar2,&d,(int32 *)((long)&flen + 4),(int32 *)&flen,(int32 **)&temp)
  ;
  *(float *****)&mllr_local->n_feat = ppppfVar3;
  if (((d == *(int *)&mllr_local->b) && (flen._4_4_ == *(int *)((long)&mllr_local->b + 4))) &&
     ((int)flen == *(int *)&mllr_local->h)) {
    f = 0;
    while( true ) {
      if (*(int *)((long)&mllr_local->b + 4) <= f) {
        ckd_free(temp);
        for (f = 0; g_00 = mllr_local, f < *(int *)&mllr_local->b; f = f + 1) {
          for (flen._4_4_ = 0; flen._4_4_ < *(int *)((long)&mllr_local->b + 4);
              flen._4_4_ = flen._4_4_ + 1) {
            ptr = __ckd_calloc__((long)mllr_local->cb2mllr[flen._4_4_],8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                                 ,0x222);
            for (flen._0_4_ = 0; (int)flen < *(int *)&mllr_local->h; flen._0_4_ = (int)flen + 1) {
              for (local_44 = 0; local_44 < mllr_local->cb2mllr[flen._4_4_]; local_44 = local_44 + 1
                  ) {
                *(undefined8 *)((long)ptr + (long)local_44 * 8) = 0;
                for (d = 0; d < mllr_local->cb2mllr[flen._4_4_]; d = d + 1) {
                  *(double *)((long)ptr + (long)local_44 * 8) =
                       (double)(*(float *)(*(long *)(**(long **)(*(long *)&config_local->f_argc +
                                                                (long)flen._4_4_ * 8) +
                                                    (long)local_44 * 8) + (long)d * 4) *
                               *(float *)(*(long *)(*(long *)(*(long *)(*(long *)mllr_local +
                                                                       (long)f * 8) +
                                                             (long)flen._4_4_ * 8) +
                                                   (long)(int)flen * 8) + (long)d * 4)) +
                       *(double *)((long)ptr + (long)local_44 * 8);
                }
                *(double *)((long)ptr + (long)local_44 * 8) =
                     (double)*(float *)(*(long *)(&config_local->defn->name)[flen._4_4_] +
                                       (long)local_44 * 4) +
                     *(double *)((long)ptr + (long)local_44 * 8);
              }
              for (local_44 = 0; local_44 < mllr_local->cb2mllr[flen._4_4_]; local_44 = local_44 + 1
                  ) {
                *(float *)(*(long *)(*(long *)(*(long *)(*(long *)mllr_local + (long)f * 8) +
                                              (long)flen._4_4_ * 8) + (long)(int)flen * 8) +
                          (long)local_44 * 4) = (float)*(double *)((long)ptr + (long)local_44 * 8);
                lVar1 = *(long *)(*(long *)(*(long *)(*(long *)&mllr_local->n_feat + (long)f * 8) +
                                           (long)flen._4_4_ * 8) + (long)(int)flen * 8);
                *(float *)(lVar1 + (long)local_44 * 4) =
                     *(float *)(**(long **)(config_local->json + (long)flen._4_4_ * 8) +
                               (long)local_44 * 4) * *(float *)(lVar1 + (long)local_44 * 4);
              }
            }
            ckd_free(ptr);
          }
        }
        lmath = (logmath_t *)mllr_local->A;
        dVar4 = ps_config_float(_m,"varfloor");
        gauden_dist_precompute((gauden_t *)g_00,lmath,(float32)(float)dVar4);
        return 0;
      }
      if (mllr_local->cb2mllr[f] != *(int *)((long)temp + (long)f * 4)) break;
      f = f + 1;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
            ,0x21b,"Feature lengths for means and variances differ\n");
    exit(1);
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
          ,0x218,"Mixture-gaussians dimensions for means and variances differ\n");
  exit(1);
}

Assistant:

int32
gauden_mllr_transform(gauden_t *g, ps_mllr_t *mllr, ps_config_t *config)
{
    int32 i, m, f, d, *flen;

    /* Free data if already here */
    if (g->mean)
        gauden_param_free(g->mean);
    if (g->var)
        gauden_param_free(g->var);
    if (g->det)
        ckd_free_3d(g->det);
    if (g->featlen)
        ckd_free(g->featlen);
    g->det = NULL;
    g->featlen = NULL;

    /* Reload means and variances (un-precomputed). */
    g->mean = (mfcc_t ****)gauden_param_read(ps_config_str(config, "mean"), &g->n_mgau, &g->n_feat, &g->n_density,
                      &g->featlen);
    g->var = (mfcc_t ****)gauden_param_read(ps_config_str(config, "var"), &m, &f, &d, &flen);

    /* Verify mean and variance parameter dimensions */
    if ((m != g->n_mgau) || (f != g->n_feat) || (d != g->n_density))
        E_FATAL
            ("Mixture-gaussians dimensions for means and variances differ\n");
    for (i = 0; i < g->n_feat; i++)
        if (g->featlen[i] != flen[i])
            E_FATAL("Feature lengths for means and variances differ\n");
    ckd_free(flen);

    /* Transform codebook for each stream s */
    for (i = 0; i < g->n_mgau; ++i) {
        for (f = 0; f < g->n_feat; ++f) {
            float64 *temp;
            temp = (float64 *) ckd_calloc(g->featlen[f], sizeof(float64));
            /* Transform each density d in selected codebook */
            for (d = 0; d < g->n_density; d++) {
                int l;
                for (l = 0; l < g->featlen[f]; l++) {
                    temp[l] = 0.0;
                    for (m = 0; m < g->featlen[f]; m++) {
                        /* FIXME: For now, only one class, hence the zeros below. */
                        temp[l] += mllr->A[f][0][l][m] * g->mean[i][f][d][m];
                    }
                    temp[l] += mllr->b[f][0][l];
                }

                for (l = 0; l < g->featlen[f]; l++) {
                    g->mean[i][f][d][l] = (float32) temp[l];
                    g->var[i][f][d][l] *= mllr->h[f][0][l];
                }
            }
            ckd_free(temp);
        }
    }

    /* Re-precompute (if we aren't adapting variances this isn't
     * actually necessary...) */
    gauden_dist_precompute(g, g->lmath, ps_config_float(config, "varfloor"));
    return 0;
}